

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O3

AbstractStringSerialiserPrivate * __thiscall
AbstractStringSerialiserPrivate::loadImageVariant
          (AbstractStringSerialiserPrivate *this,int type,QString *val)

{
  QBuffer buffer;
  QByteArray byteArray;
  QString local_40;
  QByteArray local_28;
  
  QString::toLatin1_helper(&local_40);
  QByteArray::fromBase64(&local_28,&local_40,0);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,1,8);
    }
  }
  QBuffer::QBuffer((QBuffer *)&local_40,&local_28,(QObject *)0x0);
  QImage::QImage((QImage *)this);
  QImage::load((QIODevice *)this,(char *)&local_40);
  QBuffer::~QBuffer((QBuffer *)&local_40);
  if (&(local_28.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_28.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_28.d.d)->super_QArrayData,1,8);
    }
  }
  return this;
}

Assistant:

QImage AbstractStringSerialiserPrivate::loadImageVariant(int type, const QString &val)
{
    Q_UNUSED(type)
    QByteArray byteArray = QByteArray::fromBase64(val.toLatin1());
    QBuffer buffer(&byteArray);
    QImage imageData;
    imageData.load(&buffer, "PNG");
    return imageData;
}